

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

VARR_token_t * do_concat(c2m_ctx_t c2m_ctx,VARR_token_t *tokens)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  token_t ptVar4;
  token_t ptVar5;
  bool bVar6;
  bool bVar7;
  token_t t;
  int len;
  int empty_k_p;
  int empty_j_p;
  int k;
  int j;
  int i;
  VARR_token_t *tokens_local;
  c2m_ctx_t c2m_ctx_local;
  
  sVar3 = VARR_token_tlength(tokens);
  t._0_4_ = (int)sVar3;
  iVar2 = (int)t;
  while( true ) {
    do {
      iVar1 = iVar2;
      k = iVar1 + -1;
      if (k < 0) {
        while (k = (int)t + -1, -1 < k) {
          ptVar4 = VARR_token_tget(tokens,(long)k);
          *(uint *)ptVar4 = *(uint *)ptVar4 & 0xffff | 0x10000;
          t._0_4_ = k;
        }
        return tokens;
      }
      ptVar4 = VARR_token_tget(tokens,(long)k);
      iVar2 = k;
    } while ((short)*(undefined4 *)ptVar4 != 0x142);
    empty_k_p = iVar1 + -2;
    if ((empty_k_p < 0) || ((int)t <= iVar1)) break;
    ptVar5 = VARR_token_tget(tokens,(long)iVar1);
    if (((short)*(undefined4 *)ptVar5 == 0x20) ||
       (ptVar5 = VARR_token_tget(tokens,(long)iVar1), empty_j_p = iVar1,
       (short)*(undefined4 *)ptVar5 == 10)) {
      empty_j_p = iVar1 + 1;
    }
    ptVar5 = VARR_token_tget(tokens,(long)empty_k_p);
    if (((short)*(undefined4 *)ptVar5 == 0x20) ||
       (ptVar5 = VARR_token_tget(tokens,(long)empty_k_p), (short)*(undefined4 *)ptVar5 == 10)) {
      empty_k_p = iVar1 + -3;
    }
    if ((empty_k_p < 0) || ((int)t <= empty_j_p)) {
      __assert_fail("k >= 0 && j < len",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0xaae,"VARR_token_t *do_concat(c2m_ctx_t, VARR_token_t *)");
    }
    ptVar5 = VARR_token_tget(tokens,(long)empty_j_p);
    bVar6 = (short)*(undefined4 *)ptVar5 == 0x141;
    ptVar5 = VARR_token_tget(tokens,(long)empty_k_p);
    bVar7 = (short)*(undefined4 *)ptVar5 == 0x141;
    if ((bVar6) || (bVar7)) {
      if (bVar6) {
        if ((empty_j_p + 1 < (int)t) &&
           ((ptVar5 = VARR_token_tget(tokens,(long)(empty_j_p + 1)),
            (short)*(undefined4 *)ptVar5 == 0x20 ||
            (ptVar5 = VARR_token_tget(tokens,(long)(empty_j_p + 1)),
            (short)*(undefined4 *)ptVar5 == 10)))) {
          empty_j_p = empty_j_p + 1;
        }
      }
      else {
        empty_j_p = empty_j_p + -1;
      }
      if (bVar7) {
        if ((empty_k_p != 0) &&
           ((ptVar5 = VARR_token_tget(tokens,(long)(empty_k_p + -1)),
            (short)*(undefined4 *)ptVar5 == 0x20 ||
            (ptVar5 = VARR_token_tget(tokens,(long)(empty_k_p + -1)),
            (short)*(undefined4 *)ptVar5 == 10)))) {
          empty_k_p = empty_k_p + -1;
        }
      }
      else {
        empty_k_p = empty_k_p + 1;
      }
      if ((bVar6) && (bVar7)) {
        del_tokens(tokens,empty_k_p,empty_j_p - empty_k_p);
        ptVar4 = new_token(c2m_ctx,ptVar4->pos,"",0x20,N_IGNORE);
        VARR_token_tset(tokens,(long)empty_k_p,ptVar4);
      }
      else {
        del_tokens(tokens,empty_k_p,(empty_j_p - empty_k_p) + 1);
      }
    }
    else {
      ptVar4 = VARR_token_tget(tokens,(long)empty_k_p);
      ptVar5 = VARR_token_tget(tokens,(long)empty_j_p);
      ptVar4 = token_concat(c2m_ctx,ptVar4,ptVar5);
      del_tokens(tokens,empty_k_p + 1,empty_j_p - empty_k_p);
      VARR_token_tset(tokens,(long)empty_k_p,ptVar4);
    }
    sVar3 = VARR_token_tlength(tokens);
    t._0_4_ = (int)sVar3;
    iVar2 = empty_k_p;
  }
  __assert_fail("k >= 0 && j < len",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0xaa9,"VARR_token_t *do_concat(c2m_ctx_t, VARR_token_t *)");
}

Assistant:

static VARR (token_t) * do_concat (c2m_ctx_t c2m_ctx, VARR (token_t) * tokens) {
  int i, j, k, empty_j_p, empty_k_p, len = (int) VARR_LENGTH (token_t, tokens);
  token_t t;

  for (i = len - 1; i >= 0; i--)
    if ((t = VARR_GET (token_t, tokens, i))->code == T_RDBLNO) {
      j = i + 1;
      k = i - 1;
      assert (k >= 0 && j < len);
      if (VARR_GET (token_t, tokens, j)->code == ' ' || VARR_GET (token_t, tokens, j)->code == '\n')
        j++;
      if (VARR_GET (token_t, tokens, k)->code == ' ' || VARR_GET (token_t, tokens, k)->code == '\n')
        k--;
      assert (k >= 0 && j < len);
      empty_j_p = VARR_GET (token_t, tokens, j)->code == T_PLM;
      empty_k_p = VARR_GET (token_t, tokens, k)->code == T_PLM;
      if (empty_j_p || empty_k_p) {
        if (!empty_j_p)
          j--;
        else if (j + 1 < len
                 && (VARR_GET (token_t, tokens, j + 1)->code == ' '
                     || VARR_GET (token_t, tokens, j + 1)->code == '\n'))
          j++;
        if (!empty_k_p)
          k++;
        else if (k != 0
                 && (VARR_GET (token_t, tokens, k - 1)->code == ' '
                     || VARR_GET (token_t, tokens, k - 1)->code == '\n'))
          k--;
        if (!empty_j_p || !empty_k_p) {
          del_tokens (tokens, k, j - k + 1);
        } else {
          del_tokens (tokens, k, j - k);
          t = new_token (c2m_ctx, t->pos, "", ' ', N_IGNORE);
          VARR_SET (token_t, tokens, k, t);
        }
      } else {
        t = token_concat (c2m_ctx, VARR_GET (token_t, tokens, k), VARR_GET (token_t, tokens, j));
        del_tokens (tokens, k + 1, j - k);
        VARR_SET (token_t, tokens, k, t);
      }
      i = k;
      len = (int) VARR_LENGTH (token_t, tokens);
    }
  for (i = len - 1; i >= 0; i--) VARR_GET (token_t, tokens, i)->processed_p = TRUE;
  return tokens;
}